

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  StackItemT<embree::NodeRefPtr<4>_> SVar11;
  StackItemT<embree::NodeRefPtr<4>_> SVar12;
  StackItemT<embree::NodeRefPtr<4>_> SVar13;
  long lVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar22;
  int iVar23;
  AABBNodeMB4D *node1;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  undefined4 uVar27;
  ulong unaff_RBP;
  undefined4 uVar28;
  ulong uVar29;
  size_t sVar30;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar31;
  ulong uVar32;
  ulong uVar33;
  vint4 bi_2;
  undefined1 auVar34 [64];
  vint4 bi_4;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vint4 ai_1;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 ai_3;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  vint4 ai;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vint4 ai_2;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  vint4 ai_4;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  vint4 bi_5;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  vfloat<4> tNear;
  vint4 bi;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar31 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar45._4_4_ = fVar2;
  auVar45._0_4_ = fVar2;
  auVar45._8_4_ = fVar2;
  auVar45._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar47._4_4_ = fVar3;
  auVar47._0_4_ = fVar3;
  auVar47._8_4_ = fVar3;
  auVar47._12_4_ = fVar3;
  uVar4 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar5 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar54._4_4_ = fVar7;
  auVar54._0_4_ = fVar7;
  auVar54._8_4_ = fVar7;
  auVar54._12_4_ = fVar7;
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar56._4_4_ = fVar8;
  auVar56._0_4_ = fVar8;
  auVar56._8_4_ = fVar8;
  auVar56._12_4_ = fVar8;
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar57._4_4_ = fVar9;
  auVar57._0_4_ = fVar9;
  auVar57._8_4_ = fVar9;
  auVar57._12_4_ = fVar9;
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar23 = (tray->tnear).field_0.i[k];
  auVar59._4_4_ = iVar23;
  auVar59._0_4_ = iVar23;
  auVar59._8_4_ = iVar23;
  auVar59._12_4_ = iVar23;
  iVar23 = (tray->tfar).field_0.i[k];
  auVar34 = ZEXT1664(CONCAT412(iVar23,CONCAT48(iVar23,CONCAT44(iVar23,iVar23))));
  auVar60._0_4_ = fVar7 * -fVar1;
  auVar60._4_4_ = fVar7 * -fVar1;
  auVar60._8_4_ = fVar7 * -fVar1;
  auVar60._12_4_ = fVar7 * -fVar1;
  auVar62._0_4_ = fVar8 * -fVar2;
  auVar62._4_4_ = fVar8 * -fVar2;
  auVar62._8_4_ = fVar8 * -fVar2;
  auVar62._12_4_ = fVar8 * -fVar2;
  auVar64._0_4_ = fVar9 * -fVar3;
  auVar64._4_4_ = fVar9 * -fVar3;
  auVar64._8_4_ = fVar9 * -fVar3;
  auVar64._12_4_ = fVar9 * -fVar3;
  while (pSVar31 != stack) {
    pSVar22 = pSVar31 + -1;
    pSVar31 = pSVar31 + -1;
    if ((float)pSVar22->dist <= *(float *)(ray + k * 4 + 0x80)) {
      sVar30 = (pSVar31->ptr).ptr;
      do {
        if ((sVar30 & 8) == 0) {
          fVar2 = *(float *)(ray + k * 4 + 0x70);
          uVar25 = (uint)sVar30 & 7;
          uVar24 = sVar30 & 0xfffffffffffffff0;
          uVar28 = (undefined4)(unaff_RBP >> 0x20);
          if (uVar25 == 3) {
            auVar36 = *(undefined1 (*) [16])(uVar24 + 0x80);
            auVar17 = *(undefined1 (*) [16])(uVar24 + 0x90);
            fVar3 = 1.0 - fVar2;
            auVar37._4_4_ = fVar3;
            auVar37._0_4_ = fVar3;
            auVar37._8_4_ = fVar3;
            auVar37._12_4_ = fVar3;
            auVar61._0_4_ = fVar2 * *(float *)(uVar24 + 0xe0);
            auVar61._4_4_ = fVar2 * *(float *)(uVar24 + 0xe4);
            auVar61._8_4_ = fVar2 * *(float *)(uVar24 + 0xe8);
            auVar61._12_4_ = fVar2 * *(float *)(uVar24 + 0xec);
            auVar63._0_4_ = fVar2 * *(float *)(uVar24 + 0xf0);
            auVar63._4_4_ = fVar2 * *(float *)(uVar24 + 0xf4);
            auVar63._8_4_ = fVar2 * *(float *)(uVar24 + 0xf8);
            auVar63._12_4_ = fVar2 * *(float *)(uVar24 + 0xfc);
            auVar55._0_4_ = fVar2 * *(float *)(uVar24 + 0x100);
            auVar55._4_4_ = fVar2 * *(float *)(uVar24 + 0x104);
            auVar55._8_4_ = fVar2 * *(float *)(uVar24 + 0x108);
            auVar55._12_4_ = fVar2 * *(float *)(uVar24 + 0x10c);
            auVar38 = ZEXT816(0) << 0x40;
            auVar19 = vfmadd231ps_fma(auVar61,auVar37,auVar38);
            auVar20 = vfmadd231ps_fma(auVar63,auVar37,auVar38);
            auVar41 = vfmadd231ps_fma(auVar55,auVar37,auVar38);
            auVar38._0_4_ = fVar6 * auVar36._0_4_;
            auVar38._4_4_ = fVar6 * auVar36._4_4_;
            auVar38._8_4_ = fVar6 * auVar36._8_4_;
            auVar38._12_4_ = fVar6 * auVar36._12_4_;
            auVar48._0_4_ = fVar6 * auVar17._0_4_;
            auVar48._4_4_ = fVar6 * auVar17._4_4_;
            auVar48._8_4_ = fVar6 * auVar17._8_4_;
            auVar48._12_4_ = fVar6 * auVar17._12_4_;
            auVar21._4_4_ = uVar5;
            auVar21._0_4_ = uVar5;
            auVar21._8_4_ = uVar5;
            auVar21._12_4_ = uVar5;
            auVar37 = vfmadd231ps_fma(auVar38,auVar21,*(undefined1 (*) [16])(uVar24 + 0x50));
            auVar38 = vfmadd231ps_fma(auVar48,auVar21,*(undefined1 (*) [16])(uVar24 + 0x60));
            auVar16._4_4_ = uVar4;
            auVar16._0_4_ = uVar4;
            auVar16._8_4_ = uVar4;
            auVar16._12_4_ = uVar4;
            auVar18 = vfmadd231ps_fma(auVar37,auVar16,*(undefined1 (*) [16])(uVar24 + 0x20));
            auVar38 = vfmadd231ps_fma(auVar38,auVar16,*(undefined1 (*) [16])(uVar24 + 0x30));
            auVar42._8_4_ = 0x7fffffff;
            auVar42._0_8_ = 0x7fffffff7fffffff;
            auVar42._12_4_ = 0x7fffffff;
            auVar37 = vandps_avx(auVar18,auVar42);
            auVar50._8_4_ = 0x219392ef;
            auVar50._0_8_ = 0x219392ef219392ef;
            auVar50._12_4_ = 0x219392ef;
            auVar37 = vcmpps_avx(auVar37,auVar50,1);
            auVar18 = vblendvps_avx(auVar18,auVar50,auVar37);
            auVar37 = vandps_avx(auVar38,auVar42);
            auVar37 = vcmpps_avx(auVar37,auVar50,1);
            auVar48 = vblendvps_avx(auVar38,auVar50,auVar37);
            auVar37 = *(undefined1 (*) [16])(uVar24 + 0xa0);
            auVar39._0_4_ = fVar6 * auVar37._0_4_;
            auVar39._4_4_ = fVar6 * auVar37._4_4_;
            auVar39._8_4_ = fVar6 * auVar37._8_4_;
            auVar39._12_4_ = fVar6 * auVar37._12_4_;
            auVar38 = vfmadd231ps_fma(auVar39,auVar21,*(undefined1 (*) [16])(uVar24 + 0x70));
            auVar21 = vfmadd231ps_fma(auVar38,auVar16,*(undefined1 (*) [16])(uVar24 + 0x40));
            auVar38 = vandps_avx(auVar21,auVar42);
            auVar38 = vcmpps_avx(auVar38,auVar50,1);
            auVar38 = vblendvps_avx(auVar21,auVar50,auVar38);
            auVar21 = vrcpps_avx(auVar18);
            auVar40._8_4_ = 0x3f800000;
            auVar40._0_8_ = &DAT_3f8000003f800000;
            auVar40._12_4_ = 0x3f800000;
            auVar18 = vfnmadd213ps_fma(auVar18,auVar21,auVar40);
            auVar21 = vfmadd132ps_fma(auVar18,auVar21,auVar21);
            auVar18 = vrcpps_avx(auVar48);
            auVar48 = vfnmadd213ps_fma(auVar48,auVar18,auVar40);
            auVar16 = vfmadd132ps_fma(auVar48,auVar18,auVar18);
            auVar18 = vrcpps_avx(auVar38);
            auVar38 = vfnmadd213ps_fma(auVar38,auVar18,auVar40);
            auVar39 = vfmadd132ps_fma(auVar38,auVar18,auVar18);
            auVar36 = vfmadd213ps_fma(auVar36,auVar47,*(undefined1 (*) [16])(uVar24 + 0xb0));
            auVar38 = vfmadd231ps_fma(auVar36,auVar45,*(undefined1 (*) [16])(uVar24 + 0x50));
            auVar36 = vfmadd213ps_fma(auVar17,auVar47,*(undefined1 (*) [16])(uVar24 + 0xc0));
            auVar17 = vfmadd213ps_fma(auVar37,auVar47,*(undefined1 (*) [16])(uVar24 + 0xd0));
            auVar36 = vfmadd231ps_fma(auVar36,auVar45,*(undefined1 (*) [16])(uVar24 + 0x60));
            auVar17 = vfmadd231ps_fma(auVar17,auVar45,*(undefined1 (*) [16])(uVar24 + 0x70));
            auVar18._4_4_ = fVar1;
            auVar18._0_4_ = fVar1;
            auVar18._8_4_ = fVar1;
            auVar18._12_4_ = fVar1;
            auVar37 = vfmadd231ps_fma(auVar38,auVar18,*(undefined1 (*) [16])(uVar24 + 0x20));
            auVar38 = vfmadd231ps_fma(auVar36,auVar18,*(undefined1 (*) [16])(uVar24 + 0x30));
            auVar48 = vfmadd231ps_fma(auVar17,auVar18,*(undefined1 (*) [16])(uVar24 + 0x40));
            auVar36 = vsubps_avx(auVar19,auVar37);
            auVar17._4_4_ = fVar3 + fVar2 * *(float *)(uVar24 + 0x114);
            auVar17._0_4_ = fVar3 + fVar2 * *(float *)(uVar24 + 0x110);
            auVar17._8_4_ = fVar3 + fVar2 * *(float *)(uVar24 + 0x118);
            auVar17._12_4_ = fVar3 + fVar2 * *(float *)(uVar24 + 0x11c);
            auVar17 = vsubps_avx(auVar17,auVar37);
            auVar37 = vsubps_avx(auVar20,auVar38);
            auVar19._4_4_ = fVar2 * *(float *)(uVar24 + 0x124) + fVar3;
            auVar19._0_4_ = fVar2 * *(float *)(uVar24 + 0x120) + fVar3;
            auVar19._8_4_ = fVar2 * *(float *)(uVar24 + 0x128) + fVar3;
            auVar19._12_4_ = fVar2 * *(float *)(uVar24 + 300) + fVar3;
            auVar38 = vsubps_avx(auVar19,auVar38);
            auVar18 = vsubps_avx(auVar41,auVar48);
            auVar20._4_4_ = fVar3 + fVar2 * *(float *)(uVar24 + 0x134);
            auVar20._0_4_ = fVar3 + fVar2 * *(float *)(uVar24 + 0x130);
            auVar20._8_4_ = fVar3 + fVar2 * *(float *)(uVar24 + 0x138);
            auVar20._12_4_ = fVar3 + fVar2 * *(float *)(uVar24 + 0x13c);
            auVar48 = vsubps_avx(auVar20,auVar48);
            auVar43._0_4_ = auVar21._0_4_ * auVar36._0_4_;
            auVar43._4_4_ = auVar21._4_4_ * auVar36._4_4_;
            auVar43._8_4_ = auVar21._8_4_ * auVar36._8_4_;
            auVar43._12_4_ = auVar21._12_4_ * auVar36._12_4_;
            auVar58._0_4_ = auVar21._0_4_ * auVar17._0_4_;
            auVar58._4_4_ = auVar21._4_4_ * auVar17._4_4_;
            auVar58._8_4_ = auVar21._8_4_ * auVar17._8_4_;
            auVar58._12_4_ = auVar21._12_4_ * auVar17._12_4_;
            auVar49._0_4_ = auVar16._0_4_ * auVar37._0_4_;
            auVar49._4_4_ = auVar16._4_4_ * auVar37._4_4_;
            auVar49._8_4_ = auVar16._8_4_ * auVar37._8_4_;
            auVar49._12_4_ = auVar16._12_4_ * auVar37._12_4_;
            auVar53._0_4_ = auVar18._0_4_ * auVar39._0_4_;
            auVar53._4_4_ = auVar18._4_4_ * auVar39._4_4_;
            auVar53._8_4_ = auVar18._8_4_ * auVar39._8_4_;
            auVar53._12_4_ = auVar18._12_4_ * auVar39._12_4_;
            auVar51._0_4_ = auVar16._0_4_ * auVar38._0_4_;
            auVar51._4_4_ = auVar16._4_4_ * auVar38._4_4_;
            auVar51._8_4_ = auVar16._8_4_ * auVar38._8_4_;
            auVar51._12_4_ = auVar16._12_4_ * auVar38._12_4_;
            auVar41._0_4_ = auVar48._0_4_ * auVar39._0_4_;
            auVar41._4_4_ = auVar48._4_4_ * auVar39._4_4_;
            auVar41._8_4_ = auVar48._8_4_ * auVar39._8_4_;
            auVar41._12_4_ = auVar48._12_4_ * auVar39._12_4_;
            auVar36 = vpminsd_avx(auVar49,auVar51);
            auVar17 = vpminsd_avx(auVar53,auVar41);
            auVar36 = vmaxps_avx(auVar36,auVar17);
            auVar18 = vpminsd_avx(auVar43,auVar58);
            auVar38 = vpmaxsd_avx(auVar43,auVar58);
            auVar17 = vpmaxsd_avx(auVar49,auVar51);
            auVar37 = vpmaxsd_avx(auVar53,auVar41);
            auVar37 = vminps_avx(auVar17,auVar37);
            auVar17 = vmaxps_avx(auVar59,auVar18);
            tNear.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar17,auVar36);
            auVar36 = vminps_avx(auVar34._0_16_,auVar38);
            auVar36 = vminps_avx(auVar36,auVar37);
            auVar36 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar36,2);
            uVar27 = vmovmskps_avx(auVar36);
            unaff_RBP = CONCAT44(uVar28,uVar27);
          }
          else {
            auVar35._4_4_ = fVar2;
            auVar35._0_4_ = fVar2;
            auVar35._8_4_ = fVar2;
            auVar35._12_4_ = fVar2;
            auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + uVar32),auVar35,
                                      *(undefined1 (*) [16])(uVar24 + 0x20 + uVar32));
            auVar36 = vfmadd213ps_fma(auVar36,auVar54,auVar60);
            auVar17 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + uVar26),auVar35,
                                      *(undefined1 (*) [16])(uVar24 + 0x20 + uVar26));
            auVar17 = vfmadd213ps_fma(auVar17,auVar56,auVar62);
            auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + uVar33),auVar35,
                                      *(undefined1 (*) [16])(uVar24 + 0x20 + uVar33));
            auVar36 = vpmaxsd_avx(auVar36,auVar17);
            auVar17 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + (uVar32 ^ 0x10)),
                                      auVar35,*(undefined1 (*) [16])
                                               (uVar24 + 0x20 + (uVar32 ^ 0x10)));
            auVar38 = vfmadd213ps_fma(auVar37,auVar57,auVar64);
            auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + (uVar26 ^ 0x10)),
                                      auVar35,*(undefined1 (*) [16])
                                               (uVar24 + 0x20 + (uVar26 ^ 0x10)));
            auVar17 = vfmadd213ps_fma(auVar17,auVar54,auVar60);
            auVar37 = vfmadd213ps_fma(auVar37,auVar56,auVar62);
            auVar37 = vpminsd_avx(auVar17,auVar37);
            auVar17 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + (uVar33 ^ 0x10)),
                                      auVar35,*(undefined1 (*) [16])
                                               (uVar24 + 0x20 + (uVar33 ^ 0x10)));
            auVar18 = vfmadd213ps_fma(auVar17,auVar57,auVar64);
            auVar17 = vpmaxsd_avx(auVar38,auVar59);
            tNear.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vpmaxsd_avx(auVar36,auVar17);
            auVar36 = vpminsd_avx(auVar18,auVar34._0_16_);
            auVar36 = vpminsd_avx(auVar37,auVar36);
            if (uVar25 == 6) {
              auVar17 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar36,2);
              auVar36 = vcmpps_avx(*(undefined1 (*) [16])(uVar24 + 0xe0),auVar35,2);
              auVar37 = vcmpps_avx(auVar35,*(undefined1 (*) [16])(uVar24 + 0xf0),1);
              auVar36 = vandps_avx(auVar36,auVar37);
              auVar36 = vandps_avx(auVar36,auVar17);
            }
            else {
              auVar36 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar36,2);
            }
            auVar36 = vpslld_avx(auVar36,0x1f);
            uVar27 = vmovmskps_avx(auVar36);
            unaff_RBP = CONCAT44(uVar28,uVar27);
          }
        }
        if ((sVar30 & 8) == 0) {
          if (unaff_RBP == 0) {
            iVar23 = 4;
          }
          else {
            uVar29 = sVar30 & 0xfffffffffffffff0;
            lVar14 = 0;
            for (uVar24 = unaff_RBP; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
              lVar14 = lVar14 + 1;
            }
            iVar23 = 0;
            uVar24 = unaff_RBP - 1 & unaff_RBP;
            sVar30 = *(ulong *)(uVar29 + lVar14 * 8);
            if (uVar24 != 0) {
              uVar25 = tNear.field_0.i[lVar14];
              lVar14 = 0;
              for (uVar15 = uVar24; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                lVar14 = lVar14 + 1;
              }
              uVar24 = uVar24 - 1 & uVar24;
              uVar15 = *(ulong *)(uVar29 + lVar14 * 8);
              uVar10 = tNear.field_0.i[lVar14];
              if (uVar24 == 0) {
                if (uVar25 < uVar10) {
                  (pSVar31->ptr).ptr = uVar15;
                  pSVar31->dist = uVar10;
                  pSVar31 = pSVar31 + 1;
                }
                else {
                  (pSVar31->ptr).ptr = sVar30;
                  pSVar31->dist = uVar25;
                  sVar30 = uVar15;
                  pSVar31 = pSVar31 + 1;
                }
              }
              else {
                auVar36._8_8_ = 0;
                auVar36._0_8_ = sVar30;
                auVar36 = vpunpcklqdq_avx(auVar36,ZEXT416(uVar25));
                auVar44._8_8_ = 0;
                auVar44._0_8_ = uVar15;
                auVar17 = vpunpcklqdq_avx(auVar44,ZEXT416(uVar10));
                lVar14 = 0;
                for (uVar15 = uVar24; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000)
                {
                  lVar14 = lVar14 + 1;
                }
                uVar24 = uVar24 - 1 & uVar24;
                auVar46._8_8_ = 0;
                auVar46._0_8_ = *(ulong *)(uVar29 + lVar14 * 8);
                auVar38 = vpunpcklqdq_avx(auVar46,ZEXT416((uint)tNear.field_0.i[lVar14]));
                auVar37 = vpcmpgtd_avx(auVar17,auVar36);
                if (uVar24 == 0) {
                  auVar18 = vpshufd_avx(auVar37,0xaa);
                  auVar37 = vblendvps_avx(auVar17,auVar36,auVar18);
                  auVar36 = vblendvps_avx(auVar36,auVar17,auVar18);
                  auVar17 = vpcmpgtd_avx(auVar38,auVar37);
                  auVar18 = vpshufd_avx(auVar17,0xaa);
                  auVar17 = vblendvps_avx(auVar38,auVar37,auVar18);
                  auVar37 = vblendvps_avx(auVar37,auVar38,auVar18);
                  auVar38 = vpcmpgtd_avx(auVar37,auVar36);
                  auVar38 = vpshufd_avx(auVar38,0xaa);
                  SVar11 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar37,auVar36,auVar38);
                  SVar12 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar36,auVar37,auVar38);
                  *pSVar31 = SVar12;
                  pSVar31[1] = SVar11;
                  sVar30 = auVar17._0_8_;
                  pSVar31 = pSVar31 + 2;
                }
                else {
                  lVar14 = 0;
                  for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                    lVar14 = lVar14 + 1;
                  }
                  auVar52._8_8_ = 0;
                  auVar52._0_8_ = *(ulong *)(uVar29 + lVar14 * 8);
                  auVar48 = vpunpcklqdq_avx(auVar52,ZEXT416((uint)tNear.field_0.i[lVar14]));
                  auVar18 = vpshufd_avx(auVar37,0xaa);
                  auVar37 = vblendvps_avx(auVar17,auVar36,auVar18);
                  auVar36 = vblendvps_avx(auVar36,auVar17,auVar18);
                  auVar17 = vpcmpgtd_avx(auVar48,auVar38);
                  auVar18 = vpshufd_avx(auVar17,0xaa);
                  auVar17 = vblendvps_avx(auVar48,auVar38,auVar18);
                  auVar38 = vblendvps_avx(auVar38,auVar48,auVar18);
                  auVar18 = vpcmpgtd_avx(auVar38,auVar36);
                  auVar48 = vpshufd_avx(auVar18,0xaa);
                  auVar18 = vblendvps_avx(auVar38,auVar36,auVar48);
                  SVar11 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar36,auVar38,auVar48);
                  auVar36 = vpcmpgtd_avx(auVar17,auVar37);
                  auVar38 = vpshufd_avx(auVar36,0xaa);
                  auVar36 = vblendvps_avx(auVar17,auVar37,auVar38);
                  auVar17 = vblendvps_avx(auVar37,auVar17,auVar38);
                  auVar37 = vpcmpgtd_avx(auVar18,auVar17);
                  auVar37 = vpshufd_avx(auVar37,0xaa);
                  SVar12 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar18,auVar17,auVar37);
                  SVar13 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar17,auVar18,auVar37);
                  *pSVar31 = SVar11;
                  pSVar31[1] = SVar13;
                  pSVar31[2] = SVar12;
                  sVar30 = auVar36._0_8_;
                  pSVar31 = pSVar31 + 3;
                }
              }
            }
          }
        }
        else {
          iVar23 = 6;
        }
      } while (iVar23 == 0);
      if (iVar23 == 6) {
        (**(code **)((long)This->leafIntersector +
                    (ulong)*(byte *)(sVar30 & 0xfffffffffffffff0) * 0x40 + 0x10))(pre,ray,k,context)
        ;
        uVar28 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar34 = ZEXT1664(CONCAT412(uVar28,CONCAT48(uVar28,CONCAT44(uVar28,uVar28))));
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }